

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O3

void __thiscall
tcmalloc::ThreadCache::ReleaseToCentralCache(ThreadCache *this,ThreadCacheFreeList *fl,int N)

{
  ulong uVar1;
  uint N_00;
  ulong uVar2;
  int N_01;
  FreeList central_fl;
  FreeList local_48;
  
  uVar1 = (fl->list_).free_count_;
  uVar2 = (ulong)(uint)N;
  if ((uint)uVar1 < (uint)N) {
    uVar2 = uVar1 & 0xffffffff;
  }
  N_00 = (uint)uVar2;
  if (0 < (int)N_00) {
    this->size_ = this->size_ - (long)(int)((int)fl->obj_bytes_ * N_00);
    N_01 = (int)*(undefined8 *)(&DAT_00108130 + (long)fl->cl_ * 0x18);
    if (N_01 < (int)N_00) {
      do {
        local_48.free_count_ = 0;
        local_48.head_ = (void *)0x0;
        ThreadCacheFreeList::PopFreeList(fl,N_01,&local_48);
        CentralFreelist::ReleaseFreeList
                  ((CentralFreelist *)(central_freelists + (long)fl->cl_ * 0x4f0),&local_48,
                   (long)N_01);
        N_00 = (int)uVar2 - N_01;
        uVar2 = (ulong)N_00;
      } while (N_01 < (int)N_00);
    }
    local_48.free_count_ = 0;
    local_48.head_ = (void *)0x0;
    ThreadCacheFreeList::PopFreeList(fl,N_00,&local_48);
    CentralFreelist::ReleaseFreeList
              ((CentralFreelist *)(central_freelists + (long)fl->cl_ * 0x4f0),&local_48,
               (long)(int)N_00);
  }
  return;
}

Assistant:

void* Alloc(size_t size, uint64_t cl) {
        assert(0 < cl && cl < kMaxClass);
        void* rv;
        if (!freelists_[cl].TryPop(&rv)) {
            FetchFromCentralCache(freelists_[cl]);
            freelists_[cl].TryPop(&rv);
        }
        size = ClassSize(cl);
        size_ -= size;
        total_alloc_ += size;
        return rv;
    }